

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtextedit.cpp
# Opt level: O2

void QTextEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  InputMethodQuery query;
  QFlagsStorage<Qt::TextInteractionFlag> *pQVar1;
  undefined1 *puVar2;
  qreal qVar3;
  PrivateShared *pPVar4;
  undefined1 *puVar5;
  bool bVar6;
  undefined1 uVar7;
  int iVar8;
  QFlagsStorage<Qt::TextInteractionFlag> QVar9;
  QTextDocument *pQVar10;
  undefined4 in_register_00000014;
  QString *placeholderText;
  long in_FS_OFFSET;
  float range;
  QVariant in_stack_ffffffffffffff88;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterPropertyMetaType < _c) goto switchD_0046292f_caseD_3;
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        textChanged((QTextEdit *)_o);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        undoAvailable((QTextEdit *)_o,*_a[1]);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        redoAvailable((QTextEdit *)_o,*_a[1]);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        currentCharFormatChanged((QTextEdit *)_o,(QTextCharFormat *)_a[1]);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        copyAvailable((QTextEdit *)_o,*_a[1]);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        selectionChanged((QTextEdit *)_o);
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        cursorPositionChanged((QTextEdit *)_o);
        return;
      }
      break;
    case 7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setFontPointSize((QTextEdit *)_o,*_a[1]);
        return;
      }
      break;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setFontFamily((QTextEdit *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setFontWeight((QTextEdit *)_o,*_a[1]);
        return;
      }
      break;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setFontUnderline((QTextEdit *)_o,*_a[1]);
        return;
      }
      break;
    case 0xb:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setFontItalic((QTextEdit *)_o,*_a[1]);
        return;
      }
      break;
    case 0xc:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setTextColor((QTextEdit *)_o,(QColor *)_a[1]);
        return;
      }
      break;
    case 0xd:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setTextBackgroundColor((QTextEdit *)_o,(QColor *)_a[1]);
        return;
      }
      break;
    case 0xe:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setCurrentFont((QTextEdit *)_o,(QFont *)_a[1]);
        return;
      }
      break;
    case 0xf:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setAlignment((QTextEdit *)_o,
                     (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                     ((QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)_a[1])->
                     super_QFlagsStorage<Qt::AlignmentFlag>);
        return;
      }
      break;
    case 0x10:
      placeholderText = (QString *)_a[1];
switchD_0046298e_caseD_9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setPlainText((QTextEdit *)_o,placeholderText);
        return;
      }
      break;
    case 0x11:
      placeholderText = (QString *)_a[1];
switchD_0046298e_caseD_8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setHtml((QTextEdit *)_o,placeholderText);
        return;
      }
      break;
    case 0x12:
      placeholderText = (QString *)_a[1];
switchD_0046298e_caseD_7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setMarkdown((QTextEdit *)_o,placeholderText);
        return;
      }
      break;
    case 0x13:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setText((QTextEdit *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 0x14:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        cut((QTextEdit *)_o);
        return;
      }
      break;
    case 0x15:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        copy((QTextEdit *)_o,
             (EVP_PKEY_CTX *)
             ((long)&switchD_0046292f::switchdataD_00665008 +
             (long)(int)(&switchD_0046292f::switchdataD_00665008)[_c]),
             (EVP_PKEY_CTX *)CONCAT44(in_register_00000014,_id));
        return;
      }
      break;
    case 0x16:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        paste((QTextEdit *)_o);
        return;
      }
      break;
    case 0x17:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        undo((QTextEdit *)_o);
        return;
      }
      break;
    case 0x18:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        redo((QTextEdit *)_o);
        return;
      }
      break;
    case 0x19:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        clear((QTextEdit *)_o);
        return;
      }
      break;
    case 0x1a:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        selectAll((QTextEdit *)_o);
        return;
      }
      break;
    case 0x1b:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        insertPlainText((QTextEdit *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 0x1c:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        insertHtml((QTextEdit *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 0x1d:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        append((QTextEdit *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 0x1e:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        scrollToAnchor((QTextEdit *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 0x1f:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        zoomIn((QTextEdit *)_o,*_a[1]);
        return;
      }
      break;
    case 0x20:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        range = 1.0;
LAB_00463372:
        zoomInF((QTextEdit *)_o,range);
        return;
      }
      break;
    case 0x21:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        zoomOut((QTextEdit *)_o,*_a[1]);
        return;
      }
      break;
    case 0x22:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        range = -1.0;
        goto LAB_00463372;
      }
      break;
    case 0x23:
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(*(long *)_o + 0x1c8))(&local_58,_o,*_a[1],_a[2]);
      goto LAB_00462e8f;
    case 0x24:
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      query = *_a[1];
      ::QVariant::QVariant((QVariant *)&stack0xffffffffffffff88,(QVariant *)_a[2]);
      inputMethodQuery((QVariant *)&local_58,(QTextEdit *)_o,query,in_stack_ffffffffffffff88);
      ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffff88);
LAB_00462e8f:
      if ((QVariant *)*_a != (QVariant *)0x0) {
        ::QVariant::operator=((QVariant *)*_a,(QVariant *)&local_58);
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
    default:
      goto switchD_0046292f_caseD_3;
    }
    goto LAB_00463476;
  case ReadProperty:
    if (0x10 < (uint)_id) goto switchD_0046292f_caseD_3;
    break;
  case WriteProperty:
    if (0x10 < (uint)_id) goto switchD_0046292f_caseD_3;
    placeholderText = (QString *)*_a;
    switch(_id) {
    case 0:
      *(undefined4 *)(*(long *)(_o + 8) + 0x300) = *(undefined4 *)&(placeholderText->d).d;
      goto switchD_0046292f_caseD_3;
    case 1:
      *(undefined1 *)(*(long *)(_o + 8) + 0x304) = *(undefined1 *)&(placeholderText->d).d;
      goto switchD_0046292f_caseD_3;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setDocumentTitle((QTextEdit *)_o,placeholderText);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setUndoRedoEnabled((QTextEdit *)_o,*(bool *)&(placeholderText->d).d);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setLineWrapMode((QTextEdit *)_o,*(LineWrapMode *)&(placeholderText->d).d);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setLineWrapColumnOrWidth((QTextEdit *)_o,*(int *)&(placeholderText->d).d);
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setReadOnly((QTextEdit *)_o,*(bool *)&(placeholderText->d).d);
        return;
      }
      break;
    case 7:
      goto switchD_0046298e_caseD_7;
    case 8:
      goto switchD_0046298e_caseD_8;
    case 9:
      goto switchD_0046298e_caseD_9;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setOverwriteMode((QTextEdit *)_o,*(bool *)&(placeholderText->d).d);
        return;
      }
      break;
    case 0xb:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setTabStopDistance((QTextEdit *)_o,(qreal)(placeholderText->d).d);
        return;
      }
      break;
    case 0xc:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setAcceptRichText((QTextEdit *)_o,*(bool *)&(placeholderText->d).d);
        return;
      }
      break;
    case 0xd:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setCursorWidth((QTextEdit *)_o,*(int *)&(placeholderText->d).d);
        return;
      }
      break;
    case 0xe:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setTextInteractionFlags
                  ((QTextEdit *)_o,
                   (QFlagsStorageHelper<Qt::TextInteractionFlag,_4>)
                   *(QFlagsStorageHelper<Qt::TextInteractionFlag,_4> *)&(placeholderText->d).d);
        return;
      }
      break;
    case 0xf:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setDocument((QTextEdit *)_o,(QTextDocument *)(placeholderText->d).d);
        return;
      }
      break;
    case 0x10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setPlaceholderText((QTextEdit *)_o,placeholderText);
        return;
      }
    }
    goto LAB_00463476;
  default:
    goto switchD_0046292f_caseD_3;
  case IndexOfMethod:
    bVar6 = QtMocHelpers::indexOfMethod<void(QTextEdit::*)()>
                      ((QtMocHelpers *)_a,(void **)textChanged,0,0);
    if ((((!bVar6) &&
         (bVar6 = QtMocHelpers::indexOfMethod<void(QTextEdit::*)(bool)>
                            ((QtMocHelpers *)_a,(void **)undoAvailable,0,1), !bVar6)) &&
        (bVar6 = QtMocHelpers::indexOfMethod<void(QTextEdit::*)(bool)>
                           ((QtMocHelpers *)_a,(void **)redoAvailable,0,2), !bVar6)) &&
       (((bVar6 = QtMocHelpers::indexOfMethod<void(QTextEdit::*)(QTextCharFormat_const&)>
                            ((QtMocHelpers *)_a,(void **)currentCharFormatChanged,0,3), !bVar6 &&
         (bVar6 = QtMocHelpers::indexOfMethod<void(QTextEdit::*)(bool)>
                            ((QtMocHelpers *)_a,(void **)copyAvailable,0,4), !bVar6)) &&
        (bVar6 = QtMocHelpers::indexOfMethod<void(QTextEdit::*)()>
                           ((QtMocHelpers *)_a,(void **)selectionChanged,0,5), !bVar6)))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QtMocHelpers::indexOfMethod<void(QTextEdit::*)()>
                  ((QtMocHelpers *)_a,(void **)cursorPositionChanged,0,6);
        return;
      }
      goto LAB_00463476;
    }
    goto switchD_0046292f_caseD_3;
  case RegisterPropertyMetaType:
    if (_id == 0xf) {
      iVar8 = qMetaTypeId<QTextDocument*>();
      *(int *)*_a = iVar8;
    }
    else {
      *(undefined4 *)*_a = 0xffffffff;
    }
    goto switchD_0046292f_caseD_3;
  }
  pQVar1 = (QFlagsStorage<Qt::TextInteractionFlag> *)*_a;
  switch(_id) {
  case 0:
    QVar9.i = *(Int *)(*(long *)(_o + 8) + 0x300);
    break;
  case 1:
    uVar7 = *(undefined1 *)(*(long *)(_o + 8) + 0x304);
    goto LAB_00462dbe;
  case 2:
    documentTitle((QString *)&local_58,(QTextEdit *)_o);
    goto LAB_00462dd3;
  case 3:
    uVar7 = isUndoRedoEnabled((QTextEdit *)_o);
    goto LAB_00462dbe;
  case 4:
    QVar9.i = *(Int *)(*(long *)(_o + 8) + 0x314);
    break;
  case 5:
    QVar9.i = *(Int *)(*(long *)(_o + 8) + 0x318);
    break;
  case 6:
    uVar7 = isReadOnly((QTextEdit *)_o);
    goto LAB_00462dbe;
  case 7:
    toMarkdown((QString *)&local_58,(QTextEdit *)_o,(MarkdownFeatures)0x104f0c);
    goto LAB_00462dd3;
  case 8:
    toHtml((QString *)&local_58,(QTextEdit *)_o);
    goto LAB_00462dd3;
  case 9:
    toPlainText((QString *)&local_58,(QTextEdit *)_o);
    goto LAB_00462dd3;
  case 10:
    uVar7 = overwriteMode((QTextEdit *)_o);
    goto LAB_00462dbe;
  case 0xb:
    qVar3 = tabStopDistance((QTextEdit *)_o);
    *(qreal *)pQVar1 = qVar3;
    goto switchD_0046292f_caseD_3;
  case 0xc:
    uVar7 = acceptRichText((QTextEdit *)_o);
LAB_00462dbe:
    *(undefined1 *)&pQVar1->i = uVar7;
    goto switchD_0046292f_caseD_3;
  case 0xd:
    QVar9.i = cursorWidth((QTextEdit *)_o);
    break;
  case 0xe:
    QVar9.i = (Int)textInteractionFlags((QTextEdit *)_o);
    break;
  case 0xf:
    pQVar10 = document((QTextEdit *)_o);
    *(QTextDocument **)pQVar1 = pQVar10;
    goto switchD_0046292f_caseD_3;
  case 0x10:
    QTextEdit::placeholderText((QString *)&local_58,(QTextEdit *)_o);
LAB_00462dd3:
    pPVar4 = *(PrivateShared **)pQVar1;
    puVar5 = *(undefined1 **)(pQVar1 + 2);
    *(PrivateShared **)pQVar1 = local_58.shared;
    *(undefined8 *)(pQVar1 + 2) = local_58._8_8_;
    puVar2 = *(undefined1 **)(pQVar1 + 4);
    *(undefined8 *)(pQVar1 + 4) = local_58._16_8_;
    local_58.shared = pPVar4;
    local_58._8_8_ = puVar5;
    local_58._16_8_ = puVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    goto switchD_0046292f_caseD_3;
  }
  pQVar1->i = QVar9.i;
switchD_0046292f_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00463476:
  __stack_chk_fail();
}

Assistant:

void QTextEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTextEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->textChanged(); break;
        case 1: _t->undoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->redoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->currentCharFormatChanged((*reinterpret_cast< std::add_pointer_t<QTextCharFormat>>(_a[1]))); break;
        case 4: _t->copyAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->selectionChanged(); break;
        case 6: _t->cursorPositionChanged(); break;
        case 7: _t->setFontPointSize((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 8: _t->setFontFamily((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 9: _t->setFontWeight((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 10: _t->setFontUnderline((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 11: _t->setFontItalic((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 12: _t->setTextColor((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        case 13: _t->setTextBackgroundColor((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        case 14: _t->setCurrentFont((*reinterpret_cast< std::add_pointer_t<QFont>>(_a[1]))); break;
        case 15: _t->setAlignment((*reinterpret_cast< std::add_pointer_t<Qt::Alignment>>(_a[1]))); break;
        case 16: _t->setPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 17: _t->setHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 18: _t->setMarkdown((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 19: _t->setText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 20: _t->cut(); break;
        case 21: _t->copy(); break;
        case 22: _t->paste(); break;
        case 23: _t->undo(); break;
        case 24: _t->redo(); break;
        case 25: _t->clear(); break;
        case 26: _t->selectAll(); break;
        case 27: _t->insertPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 28: _t->insertHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 29: _t->append((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 30: _t->scrollToAnchor((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 31: _t->zoomIn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 32: _t->zoomIn(); break;
        case 33: _t->zoomOut((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 34: _t->zoomOut(); break;
        case 35: { QVariant _r = _t->loadResource((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 36: { QVariant _r = _t->inputMethodQuery((*reinterpret_cast< std::add_pointer_t<Qt::InputMethodQuery>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)()>(_a, &QTextEdit::textChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)(bool )>(_a, &QTextEdit::undoAvailable, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)(bool )>(_a, &QTextEdit::redoAvailable, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)(const QTextCharFormat & )>(_a, &QTextEdit::currentCharFormatChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)(bool )>(_a, &QTextEdit::copyAvailable, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)()>(_a, &QTextEdit::selectionChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)()>(_a, &QTextEdit::cursorPositionChanged, 6))
            return;
    }
    if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 15:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QTextDocument* >(); break;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: QtMocHelpers::assignFlags<AutoFormatting>(_v, _t->autoFormatting()); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->tabChangesFocus(); break;
        case 2: *reinterpret_cast<QString*>(_v) = _t->documentTitle(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->isUndoRedoEnabled(); break;
        case 4: *reinterpret_cast<LineWrapMode*>(_v) = _t->lineWrapMode(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->lineWrapColumnOrWidth(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 7: *reinterpret_cast<QString*>(_v) = _t->toMarkdown(); break;
        case 8: *reinterpret_cast<QString*>(_v) = _t->toHtml(); break;
        case 9: *reinterpret_cast<QString*>(_v) = _t->toPlainText(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->overwriteMode(); break;
        case 11: *reinterpret_cast<qreal*>(_v) = _t->tabStopDistance(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->acceptRichText(); break;
        case 13: *reinterpret_cast<int*>(_v) = _t->cursorWidth(); break;
        case 14: *reinterpret_cast<Qt::TextInteractionFlags*>(_v) = _t->textInteractionFlags(); break;
        case 15: *reinterpret_cast<QTextDocument**>(_v) = _t->document(); break;
        case 16: *reinterpret_cast<QString*>(_v) = _t->placeholderText(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setAutoFormatting(*reinterpret_cast<AutoFormatting*>(_v)); break;
        case 1: _t->setTabChangesFocus(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setDocumentTitle(*reinterpret_cast<QString*>(_v)); break;
        case 3: _t->setUndoRedoEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setLineWrapMode(*reinterpret_cast<LineWrapMode*>(_v)); break;
        case 5: _t->setLineWrapColumnOrWidth(*reinterpret_cast<int*>(_v)); break;
        case 6: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setMarkdown(*reinterpret_cast<QString*>(_v)); break;
        case 8: _t->setHtml(*reinterpret_cast<QString*>(_v)); break;
        case 9: _t->setPlainText(*reinterpret_cast<QString*>(_v)); break;
        case 10: _t->setOverwriteMode(*reinterpret_cast<bool*>(_v)); break;
        case 11: _t->setTabStopDistance(*reinterpret_cast<qreal*>(_v)); break;
        case 12: _t->setAcceptRichText(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setCursorWidth(*reinterpret_cast<int*>(_v)); break;
        case 14: _t->setTextInteractionFlags(*reinterpret_cast<Qt::TextInteractionFlags*>(_v)); break;
        case 15: _t->setDocument(*reinterpret_cast<QTextDocument**>(_v)); break;
        case 16: _t->setPlaceholderText(*reinterpret_cast<QString*>(_v)); break;
        default: break;
        }
    }
}